

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O2

void __thiscall raft_functional_common::TestSm::free_user_snp_ctx(TestSm *this,void **user_snp_ctx)

{
  if (*user_snp_ctx != (void *)0x0) {
    free(*user_snp_ctx);
    std::mutex::lock(&this->openedUserCtxsLock);
    std::
    _Rb_tree<void_*,_void_*,_std::_Identity<void_*>,_std::less<void_*>,_std::allocator<void_*>_>::
    erase(&(this->openedUserCtxs)._M_t,user_snp_ctx);
    pthread_mutex_unlock((pthread_mutex_t *)&this->openedUserCtxsLock);
    return;
  }
  return;
}

Assistant:

void free_user_snp_ctx(void*& user_snp_ctx) {
        if (!user_snp_ctx) return;

        int ctx = 0;
        memcpy(&ctx, user_snp_ctx, sizeof(ctx));
        // Check magic number.
        assert(ctx == 0xabcdef);
        free(user_snp_ctx);

        std::lock_guard<std::mutex> ll(openedUserCtxsLock);
        openedUserCtxs.erase(user_snp_ctx);
    }